

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>
     ::doStartTry(Flower *self,Expression **currp)

{
  Try *local_28;
  Try *local_20;
  Try *curr;
  Expression **currp_local;
  Flower *self_local;
  
  curr = (Try *)currp;
  currp_local = (Expression **)self;
  local_20 = Expression::cast<wasm::Try>(*currp);
  std::
  vector<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>_>_>
  ::emplace_back<>((vector<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::LocalGraphInternal::Flower,_wasm::Visitor<wasm::LocalGraphInternal::Flower,_void>,_wasm::LocalGraphInternal::Info>::BasicBlock_*>_>_>_>
                    *)(currp_local + 0x41));
  local_28 = local_20;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)(currp_local + 0x44)
             ,(value_type *)&local_28);
  return;
}

Assistant:

static void doStartTry(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<Try>();
    self->throwingInstsStack.emplace_back();
    self->unwindExprStack.push_back(curr);
  }